

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

void vepu511_h265_global_cfg_set(H265eV511HalContext *ctx,H265eV511RegSet *regs)

{
  int iVar1;
  RK_U32 *local_38;
  RK_U32 *lambda_tbl;
  RK_S32 lambda_idx_p;
  H265eVepu511Param *reg_param;
  H265eVepu511Frame *reg_frm;
  H265eV511RegSet *regs_local;
  H265eV511HalContext *ctx_local;
  
  iVar1 = (ctx->cfg->tune).lambda_idx_i;
  (regs->reg_frm).sao_cfg =
       (anon_struct_4_2_3c92d8d8_for_sao_cfg)
       ((uint)(regs->reg_frm).sao_cfg & 0xfffffff8 |
       (ctx->cfg->codec).field_1.h265.sao_cfg.sao_bit_ratio & 7);
  if (ctx->frame_type == 2) {
    memcpy((regs->reg_param).pprd_lamb_satd_0_51,lambda_tbl_pre_intra,0xd0);
  }
  else {
    memcpy((regs->reg_param).pprd_lamb_satd_0_51,lambda_tbl_pre_inter,0xd0);
  }
  if (ctx->frame_type == 2) {
    local_38 = rdo_lambda_table_I + iVar1;
  }
  else {
    local_38 = rdo_lambda_table_P + (ctx->cfg->tune).lambda_idx_p;
  }
  memcpy((regs->reg_param).rdo_wgta_qp_grpa_0_51,local_38,0xd0);
  (regs->reg_rc_roi).madi_st_thd =
       (anon_struct_4_4_807e1bd2_for_madi_st_thd)
       ((uint)(regs->reg_rc_roi).madi_st_thd & 0xffffff00 | 5);
  (regs->reg_rc_roi).madi_st_thd =
       (anon_struct_4_4_807e1bd2_for_madi_st_thd)
       ((uint)(regs->reg_rc_roi).madi_st_thd & 0xffff00ff | 0xc00);
  (regs->reg_rc_roi).madi_st_thd =
       (anon_struct_4_4_807e1bd2_for_madi_st_thd)
       ((uint)(regs->reg_rc_roi).madi_st_thd & 0xff00ffff | 0x140000);
  (regs->reg_rc_roi).madp_st_thd0 =
       (anon_struct_4_4_1da63ba5_for_madp_st_thd0)
       ((uint)(regs->reg_rc_roi).madp_st_thd0 & 0xfffff000 | 0x40);
  (regs->reg_rc_roi).madp_st_thd0 =
       (anon_struct_4_4_1da63ba5_for_madp_st_thd0)
       ((uint)(regs->reg_rc_roi).madp_st_thd0 & 0xf000ffff | 0x900000);
  (regs->reg_rc_roi).madp_st_thd1 =
       (anon_struct_4_2_d4966a0a_for_madp_st_thd1)
       ((uint)(regs->reg_rc_roi).madp_st_thd1 & 0xfffff000 | 0xf0);
  (regs->reg_param).prmd_intra_lamb_ofst =
       (anon_struct_4_3_cc9ed22d_for_prmd_intra_lamb_ofst)
       ((uint)(regs->reg_param).prmd_intra_lamb_ofst & 0xffffffe0 | 0xb);
  (regs->reg_param).prmd_intra_lamb_ofst =
       (anon_struct_4_3_cc9ed22d_for_prmd_intra_lamb_ofst)
       ((uint)(regs->reg_param).prmd_intra_lamb_ofst & 0xfffffc1f | 0x160);
  return;
}

Assistant:

static void vepu511_h265_global_cfg_set(H265eV511HalContext *ctx, H265eV511RegSet *regs)
{
    H265eVepu511Frame *reg_frm = &regs->reg_frm;
    H265eVepu511Param *reg_param = &regs->reg_param;
    RK_S32 lambda_idx_p = ctx->cfg->tune.lambda_idx_i;

    reg_frm->sao_cfg.sao_lambda_multi = ctx->cfg->codec.h265.sao_cfg.sao_bit_ratio;

    if (ctx->frame_type == INTRA_FRAME) {
        memcpy(&reg_param->pprd_lamb_satd_0_51[0], lambda_tbl_pre_intra, sizeof(lambda_tbl_pre_intra));
    } else {
        memcpy(&reg_param->pprd_lamb_satd_0_51[0], lambda_tbl_pre_inter, sizeof(lambda_tbl_pre_inter));
    }

    {
        RK_U32 *lambda_tbl;

        if (ctx->frame_type == INTRA_FRAME) {
            lambda_tbl = &rdo_lambda_table_I[lambda_idx_p];
        } else {
            lambda_idx_p = ctx->cfg->tune.lambda_idx_p;
            lambda_tbl = &rdo_lambda_table_P[lambda_idx_p];
        }

        memcpy(&reg_param->rdo_wgta_qp_grpa_0_51[0], lambda_tbl, H265E_LAMBDA_TAB_SIZE);
    }

    /* 0x1064 */
    regs->reg_rc_roi.madi_st_thd.madi_th0 = 5;
    regs->reg_rc_roi.madi_st_thd.madi_th1 = 12;
    regs->reg_rc_roi.madi_st_thd.madi_th2 = 20;
    /* 0x1068 */
    regs->reg_rc_roi.madp_st_thd0.madp_th0 = 4 << 4;
    regs->reg_rc_roi.madp_st_thd0.madp_th1 = 9 << 4;
    /* 0x106C */
    regs->reg_rc_roi.madp_st_thd1.madp_th2 = 15 << 4;
    regs->reg_param.prmd_intra_lamb_ofst.lambda_luma_offset = 11;
    regs->reg_param.prmd_intra_lamb_ofst.lambda_chroma_offset = 11;

}